

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::activateLinkUnderCursor(QWidgetTextControlPrivate *this,QString href)

{
  QTextCursor *pQVar1;
  undefined1 *puVar2;
  QTextDocumentPrivate *pQVar3;
  char16_t *pcVar4;
  undefined8 uVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  MoveMode MVar10;
  int iVar11;
  QString *in_RSI;
  long in_FS_OFFSET;
  QTextCursor oldCursor;
  QTextFormat local_98 [16];
  QArrayDataPointer<char16_t> local_88;
  QTextCursor tmp;
  undefined1 local_58 [12];
  int iStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _oldCursor = &DAT_aaaaaaaaaaaaaaaa;
  pQVar1 = &this->cursor;
  QTextCursor::QTextCursor(&oldCursor,pQVar1);
  if ((in_RSI->d).size == 0) {
    _tmp = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&tmp,pQVar1);
    iVar8 = QTextCursor::selectionStart();
    iVar9 = QTextCursor::position();
    if (iVar8 != iVar9) {
      MVar10 = QTextCursor::selectionStart();
      QTextCursor::setPosition((int)&tmp,MVar10);
    }
    QTextCursor::movePosition((MoveOperation)&tmp,0x11,0);
    QTextCursor::charFormat();
    QTextCharFormat::anchorHref((QString *)local_58,(QTextCharFormat *)&local_88);
    pQVar3 = (QTextDocumentPrivate *)(in_RSI->d).d;
    pcVar4 = (in_RSI->d).ptr;
    (in_RSI->d).d = (Data *)local_58._0_8_;
    (in_RSI->d).ptr = stack0xffffffffffffffb0;
    puVar2 = (undefined1 *)(in_RSI->d).size;
    (in_RSI->d).size = (qsizetype)local_48;
    local_58._0_8_ = pQVar3;
    unique0x10000787 = pcVar4;
    local_48 = puVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
    QTextFormat::~QTextFormat((QTextFormat *)&local_88);
    QTextCursor::~QTextCursor(&tmp);
    if ((in_RSI->d).size == 0) goto LAB_0047ffe5;
  }
  cVar6 = QTextCursor::hasSelection();
  if (cVar6 == '\0') {
    _tmp = &DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::block();
    iVar8 = QTextCursor::position();
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::begin();
    while( true ) {
      if ((int)local_48 == iStack_4c) break;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::iterator::fragment();
      iVar9 = QTextFragment::position();
      if ((iVar9 <= iVar8) &&
         (iVar11 = QTextFragment::length(), pcVar4 = stack0xffffffffffffffb0, uVar5 = local_58._0_8_
         , iVar8 < iVar11 + iVar9)) {
        iVar8 = iStack_4c;
        iVar9 = (int)local_48;
        if ((int)local_48 != iStack_4c) {
          QTextBlock::iterator::fragment();
          MVar10 = QTextFragment::position();
          iVar11 = (int)pQVar1;
          QTextCursor::setPosition(iVar11,MVar10);
          QTextBlock::begin();
          if (((Data *)local_58._0_8_ == local_88.d) && ((int)local_48 == (int)local_88.size))
          goto LAB_0047fe8a;
          goto LAB_0047fde8;
        }
        break;
      }
      QTextBlock::iterator::operator++((iterator *)local_58);
    }
  }
  goto LAB_0047ff6e;
  while( true ) {
    MVar10 = QTextFragment::position();
    QTextCursor::setPosition(iVar11,MVar10);
    QTextBlock::begin();
    if (((Data *)local_58._0_8_ == local_88.d) && ((int)local_48 == (int)local_88.size)) break;
LAB_0047fde8:
    QTextBlock::iterator::operator--((iterator *)local_58);
    QTextBlock::iterator::fragment();
    QTextFragment::charFormat();
    QTextCharFormat::anchorHref((QString *)&local_88,(QTextCharFormat *)local_98);
    bVar7 = ::operator!=((QString *)&local_88,in_RSI);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QTextFormat::~QTextFormat(local_98);
    if (bVar7) break;
  }
LAB_0047fe8a:
  local_48 = (undefined1 *)CONCAT44(local_48._4_4_,iVar9);
  local_58._0_8_ = uVar5;
  unique0x1000078f = pcVar4;
  while (iVar9 != iVar8) {
    QTextBlock::iterator::fragment();
    QTextFragment::charFormat();
    QTextCharFormat::anchorHref((QString *)&local_88,(QTextCharFormat *)local_98);
    bVar7 = ::operator!=((QString *)&local_88,in_RSI);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QTextFormat::~QTextFormat(local_98);
    if (bVar7) break;
    iVar8 = QTextFragment::position();
    iVar9 = QTextFragment::length();
    QTextCursor::setPosition(iVar11,iVar8 + iVar9);
    QTextBlock::iterator::operator++((iterator *)local_58);
    iVar8 = iStack_4c;
    iVar9 = (int)local_48;
  }
LAB_0047ff6e:
  if (this->hasFocus == true) {
    this->cursorIsFocusIndicator = true;
  }
  else {
    this->cursorIsFocusIndicator = false;
    QTextCursor::clearSelection();
  }
  repaintOldAndNewSelection(this,&oldCursor);
  if (this->openExternalLinks == true) {
    QUrl::QUrl((QUrl *)local_58,(QString *)in_RSI,TolerantMode);
    QDesktopServices::openUrl((QUrl *)local_58);
    QUrl::~QUrl((QUrl *)local_58);
  }
  else {
    QWidgetTextControl::linkActivated(*(QWidgetTextControl **)&this->field_0x8,in_RSI);
  }
LAB_0047ffe5:
  QTextCursor::~QTextCursor(&oldCursor);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::activateLinkUnderCursor(QString href)
{
    QTextCursor oldCursor = cursor;

    if (href.isEmpty()) {
        QTextCursor tmp = cursor;
        if (tmp.selectionStart() != tmp.position())
            tmp.setPosition(tmp.selectionStart());
        tmp.movePosition(QTextCursor::NextCharacter);
        href = tmp.charFormat().anchorHref();
    }
    if (href.isEmpty())
        return;

    if (!cursor.hasSelection()) {
        QTextBlock block = cursor.block();
        const int cursorPos = cursor.position();

        QTextBlock::Iterator it = block.begin();
        QTextBlock::Iterator linkFragment;

        for (; !it.atEnd(); ++it) {
            QTextFragment fragment = it.fragment();
            const int fragmentPos = fragment.position();
            if (fragmentPos <= cursorPos &&
                fragmentPos + fragment.length() > cursorPos) {
                linkFragment = it;
                break;
            }
        }

        if (!linkFragment.atEnd()) {
            it = linkFragment;
            cursor.setPosition(it.fragment().position());
            if (it != block.begin()) {
                do {
                    --it;
                    QTextFragment fragment = it.fragment();
                    if (fragment.charFormat().anchorHref() != href)
                        break;
                    cursor.setPosition(fragment.position());
                } while (it != block.begin());
            }

            for (it = linkFragment; !it.atEnd(); ++it) {
                QTextFragment fragment = it.fragment();
                if (fragment.charFormat().anchorHref() != href)
                    break;
                cursor.setPosition(fragment.position() + fragment.length(), QTextCursor::KeepAnchor);
            }
        }
    }

    if (hasFocus) {
        cursorIsFocusIndicator = true;
    } else {
        cursorIsFocusIndicator = false;
        cursor.clearSelection();
    }
    repaintOldAndNewSelection(oldCursor);

#ifndef QT_NO_DESKTOPSERVICES
    if (openExternalLinks)
        QDesktopServices::openUrl(href);
    else
#endif
        emit q_func()->linkActivated(href);
}